

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 extraout_EAX;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  secp256k1_gej *a;
  ulong uVar8;
  ulong uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  secp256k1_modinv64_signed62 s;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  secp256k1_modinv64_signed62 local_58;
  
  secp256k1_scalar_verify(x);
  uVar8 = x->d[2] | x->d[0];
  uVar11 = x->d[3] | x->d[1];
  secp256k1_scalar_verify(x);
  uVar1 = x->d[0];
  uVar2 = x->d[1];
  uVar3 = x->d[2];
  uVar4 = x->d[3];
  secp256k1_scalar_verify(x);
  uVar6 = 0xffffffff;
  local_58.v[0] = uVar1 & 0x3fffffffffffffff;
  local_58.v[1] = (uVar2 & 0xfffffffffffffff) << 2 | uVar1 >> 0x3e;
  local_58.v[2] = (uVar3 & 0x3ffffffffffffff) << 4 | uVar2 >> 0x3c;
  local_58.v[3] = (uVar4 & 0xffffffffffffff) << 6 | uVar3 >> 0x3a;
  local_58.v[4] = uVar4 >> 0x38;
  secp256k1_modinv64(&local_58,&secp256k1_const_modinfo_scalar);
  secp256k1_scalar_from_signed62(r,&local_58);
  secp256k1_scalar_verify(r);
  a = (secp256k1_gej *)r;
  secp256k1_scalar_verify(r);
  auVar9._0_4_ = -(uint)((int)r->d[2] == 0 && (int)r->d[0] == 0);
  auVar9._4_4_ = -(uint)(*(int *)((long)r->d + 0x14) == 0 && *(int *)((long)r->d + 4) == 0);
  auVar9._8_4_ = -(uint)((int)r->d[3] == 0 && (int)r->d[1] == 0);
  auVar9._12_4_ = -(uint)(*(int *)((long)r->d + 0x1c) == 0 && *(int *)((long)r->d + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar9);
  local_68 = (int)uVar8;
  iStack_64 = (int)(uVar8 >> 0x20);
  iStack_60 = (int)uVar11;
  iStack_5c = (int)(uVar11 >> 0x20);
  auVar10._0_4_ = -(uint)(local_68 == 0);
  auVar10._4_4_ = -(uint)(iStack_64 == 0);
  auVar10._8_4_ = -(uint)(iStack_60 == 0);
  auVar10._12_4_ = -(uint)(iStack_5c == 0);
  iVar7 = movmskps(uVar6,auVar10);
  if ((iVar7 != 0xf) != (iVar5 == 0xf)) {
    return;
  }
  secp256k1_scalar_inverse_cold_1();
  a->infinity = 0;
  (a->x).magnitude = 0;
  (a->x).normalized = 1;
  (a->x).n[0] = 0;
  (a->x).n[1] = 0;
  (a->x).n[2] = 0;
  (a->x).n[3] = 0;
  (a->x).n[4] = 0;
  secp256k1_fe_verify(&a->x);
  (a->y).magnitude = 0;
  (a->y).normalized = 1;
  (a->y).n[0] = 0;
  (a->y).n[1] = 0;
  (a->y).n[2] = 0;
  (a->y).n[3] = 0;
  (a->y).n[4] = 0;
  secp256k1_fe_verify(&a->y);
  (a->z).magnitude = 0;
  (a->z).normalized = 1;
  (a->z).n[0] = 0;
  (a->z).n[1] = 0;
  (a->z).n[2] = 0;
  (a->z).n[3] = 0;
  (a->z).n[4] = 0;
  secp256k1_fe_verify(&a->z);
  secp256k1_gej_verify(a);
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}